

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delta.c
# Opt level: O2

void Delta_Encode(Byte *state,uint delta,Byte *data,SizeT size)

{
  Byte BVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Byte buf [256];
  Byte local_128 [256];
  
  MyMemCpy(local_128,state,delta);
  uVar2 = 0;
  uVar4 = 0;
  while (uVar3 = uVar4, uVar3 < size) {
    for (uVar2 = 0; (uVar4 = uVar3 + uVar2, uVar2 < delta && (uVar4 < size)); uVar2 = uVar2 + 1) {
      BVar1 = data[uVar2 + uVar3];
      data[uVar2 + uVar3] = BVar1 - local_128[uVar2];
      local_128[uVar2] = BVar1;
    }
  }
  uVar4 = 0;
  if ((uint)uVar2 != delta) {
    uVar4 = uVar2 & 0xffffffff;
  }
  MyMemCpy(state,local_128 + uVar4,delta - (uint)uVar4);
  MyMemCpy(state + (delta - uVar4),local_128,(uint)uVar4);
  return;
}

Assistant:

void Delta_Encode(Byte *state, unsigned delta, Byte *data, SizeT size)
{
  Byte buf[DELTA_STATE_SIZE];
  unsigned j = 0;
  MyMemCpy(buf, state, delta);
  {
    SizeT i;
    for (i = 0; i < size;)
    {
      for (j = 0; j < delta && i < size; i++, j++)
      {
        Byte b = data[i];
        data[i] = (Byte)(b - buf[j]);
        buf[j] = b;
      }
    }
  }
  if (j == delta)
    j = 0;
  MyMemCpy(state, buf + j, delta - j);
  MyMemCpy(state + delta - j, buf, j);
}